

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  int *piVar2;
  ulong *puVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  int iVar5;
  mapped_type mVar6;
  iterator iVar7;
  CornerTable *pCVar8;
  _Bit_type *p_Var9;
  pointer pIVar10;
  pointer piVar11;
  iterator iVar12;
  bool bVar13;
  pointer pIVar14;
  long lVar15;
  mapped_type *pmVar16;
  uint uVar17;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *pMVar24;
  int iVar25;
  ulong uVar26;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar27;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_7c;
  uint local_78;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_74;
  ulong local_70;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *local_68;
  int local_5c;
  int local_58;
  int local_54;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_50;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  MeshEdgebreakerTraversalValenceEncoder *local_40;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  pIVar14 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar14) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar14;
  }
  local_50 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->corner_traversal_stack_;
  iVar7._M_current =
       (this->corner_traversal_stack_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_7c.value_ = corner_id.value_;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (local_50,iVar7,&local_7c);
  }
  else {
    (iVar7._M_current)->value_ = corner_id.value_;
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  pIVar14 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pIVar14) {
    local_5c = (int)((ulong)((long)(this->mesh_->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->processed_connectivity_corners_;
    local_40 = &this->traversal_encoder_;
    local_48 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->face_to_split_symbol_map_;
    local_68 = this;
    do {
      local_7c.value_ = pIVar14[-1].value_;
      if ((local_7c.value_ == 0xffffffff) ||
         ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     + (ulong)(local_7c.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)local_7c.value_ / 3 & 0x3f) & 1) != 0)) {
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar14 + -1;
      }
      else {
        pMVar24 = this;
        iVar25 = local_5c;
        if (0 < local_5c) {
          do {
            pMVar24->last_encoded_symbol_id_ = pMVar24->last_encoded_symbol_id_ + 1;
            local_70 = (ulong)(local_7c.value_ / 3);
            if (local_7c.value_ == 0xffffffff) {
              local_70 = 0xffffffff;
            }
            puVar3 = (pMVar24->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (local_70 >> 6);
            *puVar3 = *puVar3 | 1L << ((byte)local_70 & 0x3f);
            iVar7._M_current =
                 (pMVar24->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pMVar24->processed_connectivity_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        (local_38,iVar7,&local_7c);
            }
            else {
              (iVar7._M_current)->value_ = local_7c.value_;
              (pMVar24->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            this = local_68;
            uVar19 = (ulong)local_7c.value_;
            uVar26 = 0xffffffff;
            (pMVar24->traversal_encoder_).last_corner_.value_ = local_7c.value_;
            pCVar8 = (pMVar24->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
            if (uVar19 != 0xffffffff) {
              uVar26 = (ulong)*(uint *)(*(long *)&(pCVar8->corner_to_vertex_map_).vector_ +
                                       uVar19 * 4);
            }
            p_Var9 = (pMVar24->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iVar5 = (pMVar24->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar26];
            if (((p_Var9[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) == 0) &&
               (puVar3 = p_Var9 + (uVar26 >> 6), *puVar3 = *puVar3 | 1L << ((byte)uVar26 & 0x3f),
               iVar5 == -1)) {
              piVar2 = &(pMVar24->traversal_encoder_).num_symbols_;
              *piVar2 = *piVar2 + 1;
              IVar27.value_ = local_7c.value_;
              if ((local_7c.value_ != 0xffffffff) &&
                 (IVar27.value_ = local_7c.value_ + 1, IVar27.value_ * -0x55555555 < 0x55555556)) {
                IVar27.value_ = local_7c.value_ - 2;
              }
              IVar18.value_ = local_7c.value_;
              if (local_7c.value_ != 0xffffffff) {
                IVar18.value_ =
                     ((local_7c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_7c.value_;
              }
              pIVar10 = (pMVar24->traversal_encoder_).corner_to_vertex_map_.vector_.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar11 = (pMVar24->traversal_encoder_).vertex_valences_.vector_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar23 = pIVar10[IVar27.value_].value_;
              iVar5 = piVar11[uVar23];
              piVar11[uVar23] = iVar5 + -1;
              piVar11[pIVar10[IVar18.value_].value_] = piVar11[pIVar10[IVar18.value_].value_] + -1;
              lVar15 = (long)(pMVar24->traversal_encoder_).prev_symbol_;
              if (lVar15 != -1) {
                iVar21 = (pMVar24->traversal_encoder_).max_valence_;
                iVar22 = iVar5;
                if (iVar21 <= iVar5) {
                  iVar22 = iVar21;
                }
                iVar21 = (pMVar24->traversal_encoder_).min_valence_;
                iVar22 = iVar22 - iVar21;
                if (iVar5 < iVar21) {
                  iVar22 = 0;
                }
                pvVar4 = (pMVar24->traversal_encoder_).context_symbols_.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar22;
                local_78 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar15 * 4);
                iVar12._M_current =
                     (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar12._M_current ==
                    (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(pvVar4,iVar12,&local_78);
                }
                else {
                  *iVar12._M_current = local_78;
                  (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                }
              }
              (pMVar24->traversal_encoder_).prev_symbol_ = 0;
              IVar27.value_ = local_7c.value_;
              if ((local_7c.value_ != 0xffffffff) &&
                 (IVar27.value_ = local_7c.value_ + 1, IVar27.value_ * -0x55555555 < 0x55555556)) {
                IVar27.value_ = local_7c.value_ - 2;
              }
              this = pMVar24;
              local_7c.value_ = IVar27.value_;
              if (IVar27.value_ != 0xffffffff) {
                local_7c.value_ =
                     *(uint *)(*(long *)&(((pMVar24->corner_table_)._M_t.
                                           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                           .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                          _M_head_impl)->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar27.value_ * 4);
              }
            }
            else {
              if ((local_7c.value_ != 0xffffffff) &&
                 (uVar19 = (ulong)(local_7c.value_ + 1),
                 (local_7c.value_ + 1) * -0x55555555 < 0x55555556)) {
                uVar19 = (ulong)(local_7c.value_ - 2);
              }
              uVar23 = (uint)uVar19;
              if (uVar23 != 0xffffffff) {
                uVar23 = *(uint *)(*(long *)&(pCVar8->opposite_corners_).vector_.
                                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  + uVar19 * 4);
              }
              IVar27.value_ = local_7c.value_;
              if (local_7c.value_ != 0xffffffff) {
                IVar27.value_ =
                     ((local_7c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_7c.value_;
              }
              if (IVar27.value_ != 0xffffffff) {
                IVar27.value_ =
                     *(uint *)(*(long *)&(pCVar8->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar27.value_ * 4);
              }
              uVar17 = uVar23 / 3;
              if (uVar23 == 0xffffffff) {
                uVar17 = 0xffffffff;
              }
              uVar20 = IVar27.value_ / 3;
              if (IVar27.value_ == 0xffffffff) {
                uVar20 = 0xffffffff;
              }
              local_74.value_ = uVar23;
              local_58 = iVar5;
              local_54 = iVar25;
              bVar13 = IsRightFaceVisited(local_68,(CornerIndex)local_7c.value_);
              if (bVar13) {
                if (uVar23 != 0xffffffff) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,(int)local_70,RIGHT_FACE_EDGE,uVar17
                            );
                }
                bVar13 = IsLeftFaceVisited(this,(CornerIndex)local_7c.value_);
                if (bVar13) {
                  if (IVar27.value_ != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,(int)local_70,LEFT_FACE_EDGE,
                               uVar20);
                  }
                  piVar2 = &(this->traversal_encoder_).num_symbols_;
                  *piVar2 = *piVar2 + 1;
                  uVar23 = (this->traversal_encoder_).last_corner_.value_;
                  uVar17 = uVar23;
                  if ((ulong)uVar23 != 0xffffffff) {
                    uVar17 = uVar23 - 2;
                    if (0x55555555 < (uVar23 + 1) * -0x55555555) {
                      uVar17 = uVar23 + 1;
                    }
                  }
                  if (uVar23 == 0xffffffff) {
                    uVar20 = 0xffffffff;
                  }
                  else {
                    uVar20 = ((uVar23 * -0x55555555 < 0x55555556) - 1 | 2) + uVar23;
                  }
                  pIVar10 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar11 = (this->traversal_encoder_).vertex_valences_.vector_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  iVar25 = piVar11[pIVar10[uVar17].value_];
                  piVar11[pIVar10[uVar23].value_] = piVar11[pIVar10[uVar23].value_] + -2;
                  piVar11[pIVar10[uVar17].value_] = piVar11[pIVar10[uVar17].value_] + -2;
                  piVar11[pIVar10[uVar20].value_] = piVar11[pIVar10[uVar20].value_] + -2;
                  lVar15 = (long)(this->traversal_encoder_).prev_symbol_;
                  if (lVar15 != -1) {
                    iVar5 = (this->traversal_encoder_).min_valence_;
                    iVar21 = (this->traversal_encoder_).max_valence_;
                    if (iVar25 < iVar21) {
                      iVar21 = iVar25;
                    }
                    iVar21 = iVar21 - iVar5;
                    if (iVar25 < iVar5) {
                      iVar21 = 0;
                    }
                    pvVar4 = (this->traversal_encoder_).context_symbols_.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar21;
                    local_78 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar15 * 4);
                    iVar12._M_current =
                         (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar12._M_current ==
                        (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>(pvVar4,iVar12,&local_78);
                    }
                    else {
                      *iVar12._M_current = local_78;
                      (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                    }
                  }
                  (this->traversal_encoder_).prev_symbol_ = 7;
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  break;
                }
                piVar2 = &(this->traversal_encoder_).num_symbols_;
                *piVar2 = *piVar2 + 1;
                uVar23 = (this->traversal_encoder_).last_corner_.value_;
                uVar17 = uVar23;
                if (((ulong)uVar23 != 0xffffffff) &&
                   (uVar17 = uVar23 + 1, uVar17 * -0x55555555 < 0x55555556)) {
                  uVar17 = uVar23 - 2;
                }
                if (uVar23 == 0xffffffff) {
                  uVar20 = 0xffffffff;
                }
                else {
                  uVar20 = ((uVar23 * -0x55555555 < 0x55555556) - 1 | 2) + uVar23;
                }
                pIVar10 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                piVar11 = (this->traversal_encoder_).vertex_valences_.vector_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar25 = piVar11[pIVar10[uVar17].value_];
                piVar11[pIVar10[uVar23].value_] = piVar11[pIVar10[uVar23].value_] + -1;
                piVar11[pIVar10[uVar17].value_] = piVar11[pIVar10[uVar17].value_] + -1;
                piVar11[pIVar10[uVar20].value_] = piVar11[pIVar10[uVar20].value_] + -2;
                lVar15 = (long)(this->traversal_encoder_).prev_symbol_;
                if (lVar15 != -1) {
                  iVar5 = (this->traversal_encoder_).max_valence_;
                  iVar21 = iVar25;
                  if (iVar5 <= iVar25) {
                    iVar21 = iVar5;
                  }
                  iVar5 = (this->traversal_encoder_).min_valence_;
                  iVar21 = iVar21 - iVar5;
                  if (iVar25 < iVar5) {
                    iVar21 = 0;
                  }
                  pvVar4 = (this->traversal_encoder_).context_symbols_.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar21;
                  local_78 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar15 * 4);
                  iVar12._M_current =
                       (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar12._M_current ==
                      (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>(pvVar4,iVar12,&local_78);
                  }
                  else {
                    *iVar12._M_current = local_78;
                    (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                  }
                }
                (this->traversal_encoder_).prev_symbol_ = 5;
                iVar25 = local_54;
                local_7c.value_ = IVar27.value_;
              }
              else {
                bVar13 = IsLeftFaceVisited(this,(CornerIndex)local_7c.value_);
                if (!bVar13) {
                  MeshEdgebreakerTraversalValenceEncoder::EncodeSymbol(local_40,TOPOLOGY_S);
                  this->num_split_symbols_ = this->num_split_symbols_ + 1;
                  if (local_58 != -1) {
                    uVar26 = (ulong)(this->vertex_hole_id_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar26];
                    uVar19 = uVar26 + 0x3f;
                    if (-1 < (long)uVar26) {
                      uVar19 = uVar26;
                    }
                    if (((this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar19 >> 6) +
                          (ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff] >> (uVar26 & 0x3f) & 1) == 0) {
                      EncodeHole(this,(CornerIndex)local_7c.value_,false);
                    }
                  }
                  mVar6 = local_68->last_encoded_symbol_id_;
                  local_78 = (uint)local_70;
                  pmVar16 = std::__detail::
                            _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_48,(key_type *)&local_78);
                  this = local_68;
                  *pmVar16 = mVar6;
                  iVar7._M_current =
                       (local_68->corner_traversal_stack_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  iVar7._M_current[-1].value_ = IVar27.value_;
                  if (iVar7._M_current ==
                      (local_68->corner_traversal_stack_).
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    ::
                    _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                              (local_50,iVar7,&local_74);
                  }
                  else {
                    (iVar7._M_current)->value_ = local_74.value_;
                    (local_68->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                  }
                  break;
                }
                if (IVar27.value_ != 0xffffffff) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,(int)local_70,LEFT_FACE_EDGE,uVar20)
                  ;
                }
                piVar2 = &(this->traversal_encoder_).num_symbols_;
                *piVar2 = *piVar2 + 1;
                uVar23 = (this->traversal_encoder_).last_corner_.value_;
                uVar17 = uVar23;
                if (((ulong)uVar23 != 0xffffffff) &&
                   (uVar17 = uVar23 + 1, uVar17 * -0x55555555 < 0x55555556)) {
                  uVar17 = uVar23 - 2;
                }
                if (uVar23 == 0xffffffff) {
                  uVar20 = 0xffffffff;
                }
                else {
                  uVar20 = ((uVar23 * -0x55555555 < 0x55555556) - 1 | 2) + uVar23;
                }
                pIVar10 = (this->traversal_encoder_).corner_to_vertex_map_.vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                piVar11 = (this->traversal_encoder_).vertex_valences_.vector_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar25 = piVar11[pIVar10[uVar17].value_];
                piVar11[pIVar10[uVar23].value_] = piVar11[pIVar10[uVar23].value_] + -1;
                piVar11[pIVar10[uVar17].value_] = piVar11[pIVar10[uVar17].value_] + -2;
                piVar11[pIVar10[uVar20].value_] = piVar11[pIVar10[uVar20].value_] + -1;
                lVar15 = (long)(this->traversal_encoder_).prev_symbol_;
                if (lVar15 != -1) {
                  iVar5 = (this->traversal_encoder_).max_valence_;
                  iVar21 = iVar25;
                  if (iVar5 <= iVar25) {
                    iVar21 = iVar5;
                  }
                  iVar5 = (this->traversal_encoder_).min_valence_;
                  iVar21 = iVar21 - iVar5;
                  if (iVar25 < iVar5) {
                    iVar21 = 0;
                  }
                  pvVar4 = (this->traversal_encoder_).context_symbols_.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar21;
                  local_78 = *(uint *)(edge_breaker_topology_to_symbol_id + lVar15 * 4);
                  iVar12._M_current =
                       (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar12._M_current ==
                      (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>(pvVar4,iVar12,&local_78);
                  }
                  else {
                    *iVar12._M_current = local_78;
                    (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                  }
                }
                (this->traversal_encoder_).prev_symbol_ = 3;
                iVar25 = local_54;
                local_7c.value_ = local_74.value_;
              }
            }
            iVar25 = iVar25 + -1;
            pMVar24 = this;
          } while (iVar25 != 0);
        }
      }
      pIVar14 = (this->corner_traversal_stack_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pIVar14);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}